

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Value_Input.cxx
# Opt level: O0

void __thiscall Fl_Value_Input::Fl_Value_Input(Fl_Value_Input *this,int X,int Y,int W,int H,char *l)

{
  Fl_Boxtype new_box;
  Fl_Color FVar1;
  Fl_Group *pFVar2;
  char *l_local;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Value_Input *this_local;
  
  Fl_Valuator::Fl_Valuator(&this->super_Fl_Valuator,X,Y,W,H,l);
  (this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget =
       (_func_int **)&PTR__Fl_Value_Input_002edd50;
  Fl_Input::Fl_Input(&this->input,X,Y,W,H,(char *)0x0);
  this->soft_ = '\0';
  pFVar2 = Fl_Widget::parent((Fl_Widget *)&this->input);
  if (pFVar2 != (Fl_Group *)0x0) {
    pFVar2 = Fl_Widget::parent((Fl_Widget *)&this->input);
    Fl_Group::remove(pFVar2,(char *)&this->input);
  }
  Fl_Widget::parent((Fl_Widget *)&this->input,(Fl_Group *)this);
  Fl_Widget::callback((Fl_Widget *)&this->input,input_cb,this);
  Fl_Widget::when((Fl_Widget *)&this->input,'\x01');
  new_box = Fl_Widget::box((Fl_Widget *)&this->input);
  Fl_Widget::box((Fl_Widget *)this,new_box);
  FVar1 = Fl_Widget::color((Fl_Widget *)&this->input);
  Fl_Widget::color((Fl_Widget *)this,FVar1);
  FVar1 = Fl_Widget::selection_color((Fl_Widget *)&this->input);
  Fl_Widget::selection_color((Fl_Widget *)this,FVar1);
  Fl_Widget::align((Fl_Widget *)this,4);
  (*(this->super_Fl_Valuator).super_Fl_Widget._vptr_Fl_Widget[10])();
  Fl_Widget::set_flag((Fl_Widget *)this,0x40);
  return;
}

Assistant:

Fl_Value_Input::Fl_Value_Input(int X, int Y, int W, int H, const char* l)
: Fl_Valuator(X, Y, W, H, l), input(X, Y, W, H, 0) {
  soft_ = 0;
  if (input.parent())  // defeat automatic-add
    input.parent()->remove(input);
  input.parent((Fl_Group *)this); // kludge!
  input.callback(input_cb, this);
  input.when(FL_WHEN_CHANGED);
  box(input.box());
  color(input.color());
  selection_color(input.selection_color());
  align(FL_ALIGN_LEFT);
  value_damage();
  set_flag(SHORTCUT_LABEL);
}